

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<14,_uWS::WebSocketHandshake::Sha1Loop<3>_>::operator()
          (static_for<14,_uWS::WebSocketHandshake::Sha1Loop<3>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<13,_uWS::WebSocketHandshake::Sha1Loop<3>_> local_11;
  
  static_for<13,_uWS::WebSocketHandshake::Sha1Loop<3>_>::operator()(&local_11,a,b);
  uVar1 = b[9] ^ b[0xe] ^ b[3] ^ b[1];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[1] = uVar2;
  uVar1 = a[1];
  a[3] = a[3] + (a[2] << 5 | a[2] >> 0x1b) + (*a ^ a[4] ^ uVar1) + uVar2 + 0x6ed9eba1;
  a[1] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }